

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O1

size_t ZSTD_loadDictionaryContent
                 (ZSTD_matchState_t *ms,ZSTD_CCtx_params *params,void *src,size_t srcSize,
                 ZSTD_dictTableLoadMethod_e dtlm)

{
  BYTE *iend;
  BYTE *pBVar1;
  BYTE *pBVar2;
  U32 UVar3;
  uint uVar4;
  U32 UVar5;
  long lVar6;
  ulong uVar7;
  undefined4 extraout_var;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  uint uVar8;
  ZSTD_compressionParameters *cParams;
  
  iend = (BYTE *)((long)src + srcSize);
  pBVar1 = (ms->window).nextSrc;
  if (pBVar1 != (BYTE *)src) {
    pBVar2 = (ms->window).base;
    lVar6 = (long)pBVar1 - (long)pBVar2;
    UVar5 = (ms->window).dictLimit;
    (ms->window).lowLimit = UVar5;
    UVar3 = (U32)lVar6;
    (ms->window).dictLimit = UVar3;
    (ms->window).dictBase = pBVar2;
    (ms->window).base = (BYTE *)((long)src - lVar6);
    if (UVar3 - UVar5 < 8) {
      (ms->window).lowLimit = UVar3;
    }
  }
  (ms->window).nextSrc = iend;
  pBVar1 = (ms->window).dictBase;
  uVar4 = (ms->window).dictLimit;
  if (src < pBVar1 + uVar4 && pBVar1 + (ms->window).lowLimit < iend) {
    uVar8 = (uint)((long)iend - (long)pBVar1);
    if ((long)(ulong)uVar4 < (long)iend - (long)pBVar1) {
      uVar8 = uVar4;
    }
    (ms->window).lowLimit = uVar8;
  }
  uVar7 = 0;
  if (params->forceWindow == 0) {
    uVar7 = (ulong)(uint)((int)iend - *(int *)&(ms->window).base);
  }
  ms->loadedDictEnd = (U32)uVar7;
  if (8 < srcSize) {
    uVar4 = (params->cParams).strategy - ZSTD_fast;
    uVar7 = (ulong)uVar4;
    if (uVar4 < 8) {
      cParams = &params->cParams;
      switch(uVar7) {
      case 0:
        ZSTD_fillHashTable(ms,cParams,iend,dtlm);
        uVar7 = extraout_RAX_00;
        break;
      case 1:
        ZSTD_fillDoubleHashTable(ms,cParams,iend,dtlm);
        uVar7 = extraout_RAX_01;
        break;
      default:
        UVar5 = ZSTD_insertAndFindFirstIndex(ms,cParams,iend + -8);
        uVar7 = CONCAT44(extraout_var,UVar5);
        break;
      case 5:
      case 6:
      case 7:
        ZSTD_updateTree(ms,cParams,iend + -8,iend);
        uVar7 = extraout_RAX;
      }
    }
    ms->nextToUpdate = (int)iend - *(int *)&(ms->window).base;
  }
  return uVar7;
}

Assistant:

static size_t ZSTD_loadDictionaryContent(ZSTD_matchState_t* ms,
                                         ZSTD_CCtx_params const* params,
                                         const void* src, size_t srcSize,
                                         ZSTD_dictTableLoadMethod_e dtlm)
{
    const BYTE* const ip = (const BYTE*) src;
    const BYTE* const iend = ip + srcSize;
    ZSTD_compressionParameters const* cParams = &params->cParams;

    ZSTD_window_update(&ms->window, src, srcSize);
    ms->loadedDictEnd = params->forceWindow ? 0 : (U32)(iend - ms->window.base);

    if (srcSize <= HASH_READ_SIZE) return 0;

    switch(params->cParams.strategy)
    {
    case ZSTD_fast:
        ZSTD_fillHashTable(ms, cParams, iend, dtlm);
        break;
    case ZSTD_dfast:
        ZSTD_fillDoubleHashTable(ms, cParams, iend, dtlm);
        break;

    case ZSTD_greedy:
    case ZSTD_lazy:
    case ZSTD_lazy2:
        if (srcSize >= HASH_READ_SIZE)
            ZSTD_insertAndFindFirstIndex(ms, cParams, iend-HASH_READ_SIZE);
        break;

    case ZSTD_btlazy2:   /* we want the dictionary table fully sorted */
    case ZSTD_btopt:
    case ZSTD_btultra:
        if (srcSize >= HASH_READ_SIZE)
            ZSTD_updateTree(ms, cParams, iend-HASH_READ_SIZE, iend);
        break;

    default:
        assert(0);  /* not possible : not a valid strategy id */
    }

    ms->nextToUpdate = (U32)(iend - ms->window.base);
    return 0;
}